

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::DistantLightSource::writeTo(DistantLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::writeRaw(binary,&this->from,0xc);
  BinaryWriter::writeRaw(binary,&this->to,0xc);
  BinaryWriter::writeRaw(binary,&this->L,0xc);
  BinaryWriter::writeRaw(binary,&this->scale,0xc);
  BinaryWriter::writeRaw(binary,&this->transform,0x30);
  return 0x47;
}

Assistant:

int DistantLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(L);
    binary.write(scale);
    binary.write(transform);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }